

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_asn1.cc
# Opt level: O1

int i2d_SSL_SESSION(SSL_SESSION *in,uchar **pp)

{
  ulong __n;
  int iVar1;
  int iVar2;
  size_t len;
  uint8_t *out;
  int local_20;
  undefined4 uStack_1c;
  uint8_t *local_18;
  
  iVar1 = SSL_SESSION_to_bytes((SSL_SESSION *)in,&local_18,(size_t *)&local_20);
  iVar2 = -1;
  if (iVar1 != 0) {
    __n = CONCAT44(uStack_1c,local_20);
    if ((__n & 0xffffffff80000000) == 0) {
      if (pp != (uchar **)0x0) {
        if (__n != 0) {
          memcpy(*pp,local_18,__n);
        }
        *pp = *pp + CONCAT44(uStack_1c,local_20);
      }
      OPENSSL_free(local_18);
      iVar2 = local_20;
    }
    else {
      OPENSSL_free(local_18);
      ERR_put_error(0x10,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                    ,0x300);
    }
  }
  return iVar2;
}

Assistant:

int i2d_SSL_SESSION(SSL_SESSION *in, uint8_t **pp) {
  uint8_t *out;
  size_t len;

  if (!SSL_SESSION_to_bytes(in, &out, &len)) {
    return -1;
  }

  if (len > INT_MAX) {
    OPENSSL_free(out);
    OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
    return -1;
  }

  if (pp) {
    OPENSSL_memcpy(*pp, out, len);
    *pp += len;
  }
  OPENSSL_free(out);

  return len;
}